

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_vector_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::VolumeMeshVectorQuantity::VolumeMeshVectorQuantity
          (VolumeMeshVectorQuantity *this,string *name,VolumeMesh *mesh_,
          VolumeMeshElement definedOn_)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  VolumeMeshQuantity::VolumeMeshQuantity((VolumeMeshQuantity *)this,&local_40,mesh_,false);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)this = &PTR__Quantity_00598e90;
  this->definedOn = definedOn_;
  return;
}

Assistant:

VolumeMeshVectorQuantity::VolumeMeshVectorQuantity(std::string name, VolumeMesh& mesh_, VolumeMeshElement definedOn_)
    : VolumeMeshQuantity(name, mesh_), definedOn(definedOn_) {}